

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VCompare(N_Vector X,N_Vector Z,sunindextype param_3,int myid)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  realtype rVar5;
  long local_58;
  sunindextype i;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  int fails;
  int mask;
  int myid_local;
  sunindextype local_length_local;
  N_Vector Z_local;
  N_Vector X_local;
  
  start_time._4_4_ = 0;
  bVar1 = false;
  if (param_3 < 3) {
    printf("Error Test_N_VCompare: Local vector length is %ld, length must be >= 3\n",param_3);
    X_local._4_4_ = 1;
  }
  else {
    for (local_58 = 0; local_58 < param_3; local_58 = local_58 + 1) {
      set_element(Z,local_58,-1.0);
      iVar2 = (int)local_58 + (int)(local_58 / 3) * -3;
      if (iVar2 == 0) {
        set_element(X,local_58,0.0);
      }
      else if (iVar2 == 1) {
        set_element(X,local_58,-1.0);
      }
      else if (iVar2 == 2) {
        set_element(X,local_58,-2.0);
      }
    }
    dVar3 = get_time();
    N_VCompare(1.0,X,Z);
    sync_device();
    dVar4 = get_time();
    for (local_58 = 0; local_58 < param_3; local_58 = local_58 + 1) {
      iVar2 = (int)local_58 + (int)(local_58 / 3) * -3;
      if (iVar2 == 0) {
        rVar5 = get_element(Z,local_58);
        if ((rVar5 != 0.0) || (NAN(rVar5))) {
          bVar1 = true;
        }
      }
      else if (iVar2 == 1) {
        rVar5 = get_element(Z,local_58);
        if ((rVar5 != 1.0) || (NAN(rVar5))) {
          bVar1 = true;
        }
      }
      else if (iVar2 == 2) {
        rVar5 = get_element(Z,local_58);
        if ((rVar5 != 1.0) || (NAN(rVar5))) {
          bVar1 = true;
        }
      }
    }
    if (bVar1) {
      printf(">>> FAILED test -- N_VCompare, Proc %d \n",(ulong)(uint)myid);
      start_time._4_4_ = 1;
    }
    else if (myid == 0) {
      printf("PASSED test -- N_VCompare \n");
    }
    dVar3 = max_time(X,dVar4 - dVar3);
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n",dVar3,"N_VCompare");
    }
    X_local._4_4_ = start_time._4_4_;
  }
  return X_local._4_4_;
}

Assistant:

int Test_N_VCompare(N_Vector X, N_Vector Z, sunindextype local_length, int myid)
{
  int          mask, fails = 0, failure = 0;
  double       start_time, stop_time, maxt;
  sunindextype i;

  if (local_length < 3) {
    printf("Error Test_N_VCompare: Local vector length is %ld, length must be >= 3\n",
           (long int) local_length);
    return(1);
  }

  /* fill vector data */
  for(i=0; i < local_length; i++){
    set_element(Z, i, NEG_ONE);

    mask = i % 3;
    switch(mask) {

    case 0 :
      /* abs(X[i]) < c */
      set_element(X, i, ZERO);
      break;

    case 1 :
      /* abs(X[i]) = c */
      set_element(X, i, NEG_ONE);
      break;

    case 2 :
      /* abs(X[i]) > c */
      set_element(X, i, NEG_TWO);
      break;
    }
  }

  start_time = get_time();
  N_VCompare(ONE, X, Z);
  sync_device();
  stop_time = get_time();

  /* check return vector */
  for(i=0; i < local_length; i++){
    mask = i % 3;

    switch(mask) {

    case 0 :
      /* Z[i] == 0 */
      if (get_element(Z, i) != ZERO)
        failure = 1;
      break;

    case 1 :
      /* Z[i] == 1 */
      if (get_element(Z, i) != ONE)
        failure = 1;
      break;

    case 2 :
      /* Z[i] == 1 */
      if (get_element(Z, i) != ONE)
        failure = 1;
      break;
    }
  }

  if (failure) {
    printf(">>> FAILED test -- N_VCompare, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VCompare \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VCompare", maxt);

  return(fails);
}